

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_storeSolutionRealFromPresol
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_03;
  undefined1 *puVar1;
  pointer pnVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar4;
  int i;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  long lVar8;
  byte bVar9;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar9 = 0;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->_basisStatusRows,
           (this->_realLP->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->_basisStatusCols,
           (this->_realLP->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  this_00 = &this->_solReal;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this_00->_primal,
          (this->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  this_01 = &(this->_solReal)._slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_01,(this->_realLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum,true);
  this_02 = &(this->_solReal)._dual;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_02,(this->_realLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum,true);
  this_03 = &(this->_solReal)._redCost;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_03,(this->_realLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum,true);
  _loadRealLP(this,true);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getBasis(&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
             (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  (*this->_simplifier->_vptr_SPxSimplifier[6])
            (this->_simplifier,this_00,this_02,this_01,this_03,(this->_basisStatusRows).data,
             (this->_basisStatusCols).data);
  iVar3 = (*this->_simplifier->_vptr_SPxSimplifier[9])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&this_00->_primal,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*this->_simplifier->_vptr_SPxSimplifier[0xb])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_01,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*this->_simplifier->_vptr_SPxSimplifier[10])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_02,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(extraout_var_01,iVar3));
  iVar3 = (*this->_simplifier->_vptr_SPxSimplifier[0xc])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_03,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(extraout_var_02,iVar3));
  if (this->_isRealLPScaled == true) {
    _unscaleSolutionReal(this,this->_realLP,true);
  }
  lVar8 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_1b8,this->_currentSettings->_realParamValues[0x17],(type *)0x0);
  pcVar5 = &local_1b8;
  pcVar6 = &local_130;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pcVar6->data)._M_elems[0] = (pcVar5->data)._M_elems[0];
    pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar9 * -8 + 4);
    pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  local_130.exp = local_1b8.exp;
  local_130.neg = local_1b8.neg;
  local_130.fpclass = local_1b8.fpclass;
  local_130.prec_elem = local_1b8.prec_elem;
  for (lVar4 = 0;
      lVar4 < (this->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum; lVar4 = lVar4 + 1) {
    pnVar2 = (this->_solReal)._primal.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    objReal((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_b0,this,(int)lVar4);
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1b8,
               (cpp_dec_float<200U,_int,_void> *)((long)(pnVar2->m_backend).data._M_elems + lVar8),
               &local_b0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&local_130,&local_1b8);
    lVar8 = lVar8 + 0x80;
  }
  pcVar5 = &local_130;
  pnVar7 = &(this->_solReal)._objVal;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = (pcVar5->data)._M_elems[0];
    pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar7 + (ulong)bVar9 * -8 + 4);
  }
  (this->_solReal)._objVal.m_backend.exp = local_130.exp;
  (this->_solReal)._objVal.m_backend.neg = local_130.neg;
  (this->_solReal)._objVal.m_backend.fpclass = local_130.fpclass;
  (this->_solReal)._objVal.m_backend.prec_elem = local_130.prec_elem;
  (*this->_simplifier->_vptr_SPxSimplifier[0xf])
            (this->_simplifier,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
             (ulong)(uint)(this->_basisStatusRows).thesize,
             (ulong)(uint)(this->_basisStatusCols).thesize);
  this->_hasBasis = true;
  this->_hasSolReal = true;
  puVar1 = &(this->_solReal).field_0x110;
  *puVar1 = *puVar1 | 5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setBasisStatus(&this->_solver,OPTIMAL);
  _verifySolutionReal(this);
  return;
}

Assistant:

void SoPlexBase<R>::_storeSolutionRealFromPresol()
{
   assert(_simplifier);
   assert(_simplifier->result() == SPxSimplifier<R>::VANISHED);

   // prepare storage for basis (enough to fit the original basis)
   _basisStatusRows.reSize(numRows());
   _basisStatusCols.reSize(numCols());

   // prepare storage for the solution data and initialize it to zero
   _solReal._primal.reDim(numCols(), true);
   _solReal._slacks.reDim(numRows(), true);
   _solReal._dual.reDim(numRows(), true);
   _solReal._redCost.reDim(numCols(), true);

   // load original LP and setup slack basis for unsimplifying
   _loadRealLP(true);

   // store slack basis
   _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                    _basisStatusRows.size(), _basisStatusCols.size());

   assert(!_simplifier->isUnsimplified());

   try
   {
      // unsimplify basis and solution data
      _simplifier->unsimplify(_solReal._primal, _solReal._dual, _solReal._slacks, _solReal._redCost,
                              _basisStatusRows.get_ptr(), _basisStatusCols.get_ptr());

   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                    "> during unsimplification. Resolving without simplifier and scaler.\n");
      _preprocessAndSolveReal(false);
      return;
   }

   // copy unsimplified solution data from simplifier
   _solReal._primal  = _simplifier->unsimplifiedPrimal();
   _solReal._slacks  = _simplifier->unsimplifiedSlacks();
   _solReal._dual    = _simplifier->unsimplifiedDual();
   _solReal._redCost = _simplifier->unsimplifiedRedCost();

   // unscale stored solution (removes persistent scaling)
   if(_isRealLPScaled)
      _unscaleSolutionReal(*_realLP, true);

   // compute the original objective function value
   StableSum<R> objVal(realParam(SoPlexBase<R>::OBJ_OFFSET));

   for(int i = 0; i < numCols(); ++i)
      objVal += _solReal._primal[i] * objReal(i);

   _solReal._objVal = R(objVal);

   // store the unsimplified basis
   _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                         _basisStatusRows.size(), _basisStatusCols.size());
   _hasBasis = true;
   _hasSolReal = true;
   _solReal._isPrimalFeasible = true;
   _solReal._isDualFeasible = true;
   _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);

   // check solution for violations and solve again if necessary
   _verifySolutionReal();
}